

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O2

void us_timer_close(us_timer_t *timer)

{
  us_poll_stop((us_poll_t *)timer,*(us_loop_t **)(timer + 0x10));
  close((*(int *)timer << 4) >> 4);
  us_poll_free((us_poll_t *)timer,*(us_loop_t **)(timer + 0x10));
  return;
}

Assistant:

void us_timer_close(struct us_timer_t *timer) {
    struct us_internal_callback_t *cb = (struct us_internal_callback_t *) timer;

    us_poll_stop(&cb->p, cb->loop);
    close(us_poll_fd(&cb->p));

    /* (regular) sockets are the only polls which are not freed immediately */
    us_poll_free((struct us_poll_t *) timer, cb->loop);
}